

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O0

void __thiscall
ClCommandLine_DoubleDashStringOption_Test::~ClCommandLine_DoubleDashStringOption_Test
          (ClCommandLine_DoubleDashStringOption_Test *this)

{
  ClCommandLine_DoubleDashStringOption_Test *this_local;
  
  anon_unknown.dwarf_19dfa::ClCommandLine::~ClCommandLine(&this->super_ClCommandLine);
  return;
}

Assistant:

TEST_F (ClCommandLine, DoubleDashStringOption) {
    opt<std::string> option ("arg");
    this->add ("progname", "--arg", "value");

    string_stream output;
    string_stream errors;
    bool const res = this->parse_command_line_options (output, errors);
    EXPECT_TRUE (res);
    EXPECT_EQ (errors.str ().length (), 0U);
    EXPECT_EQ (output.str ().length (), 0U);

    EXPECT_EQ (option.get (), "value");
    EXPECT_EQ (option.get_num_occurrences (), 1U);
}